

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetStepDirection(void *arkode_mem,sunrealtype stepdir)

{
  uint uVar1;
  int iVar2;
  sunrealtype sVar3;
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  SUNErrCode err;
  sunrealtype h;
  ARKodeMem ark_mem;
  int retval;
  sunrealtype *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  double local_30;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x54c,"ARKodeSetStepDirection",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->initsetup == 0) {
    arkProcessError(in_RDI,-0x34,0x556,"ARKodeSetStepDirection",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,"Step direction cannot be specified after module initialization.");
    local_4 = -0x34;
  }
  else {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      uVar1 = ARKodeGetStepDirection
                        ((void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc0);
      if (uVar1 != 0) {
        arkProcessError(in_RDI,(int)(ulong)uVar1,0x560,"ARKodeSetStepDirection",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                        ,"Unable to access step direction");
        return uVar1;
      }
      dVar4 = (double)((ulong)ABS(local_30) | (ulong)in_XMM0_Qa & 0x8000000000000000);
      if ((local_30 != dVar4) || (NAN(local_30) || NAN(dVar4))) {
        in_RDI->h = -local_30;
        in_RDI->h0u = 0.0;
        if (in_RDI->fixedstep == 0) {
          sVar3 = 0.0;
        }
        else {
          sVar3 = -local_30;
        }
        in_RDI->hin = sVar3;
        if (((in_RDI->hadapt_mem != (ARKodeHAdaptMem)0x0) &&
            (in_RDI->hadapt_mem->hcontroller != (SUNAdaptController)0x0)) &&
           (iVar2 = SUNAdaptController_Reset(in_RDI->hadapt_mem->hcontroller), iVar2 != 0)) {
          arkProcessError(in_RDI,-0x2f,0x57d,"ARKodeSetStepDirection",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                          ,"Unable to reset error controller object");
          return -0x2f;
        }
      }
    }
    if (in_RDI->step_setstepdirection == (ARKTimestepSetStepDirection)0x0) {
      local_4 = 0;
    }
    else {
      local_4 = (*in_RDI->step_setstepdirection)(in_RDI,in_XMM0_Qa);
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetStepDirection(void* arkode_mem, sunrealtype stepdir)
{
  /* stepdir is a sunrealtype because the direction typically comes from a time
   * step h or tend-tstart which are sunrealtypes. If stepdir was in int,
   * conversions would be required which can cause undefined behavior when
   * greater than MAX_INT */
  int retval;
  ARKodeMem ark_mem;
  sunrealtype h;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return ARK_MEM_NULL;
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* do not change direction once the module has been initialized i.e., after calling
     ARKodeEvolve unless ReInit or Reset are called. */
  if (!ark_mem->initsetup)
  {
    arkProcessError(ark_mem, ARK_STEP_DIRECTION_ERR, __LINE__, __func__,
                    __FILE__, "Step direction cannot be specified after module initialization.");
    return ARK_STEP_DIRECTION_ERR;
  }

  if (stepdir != ZERO)
  {
    retval = ARKodeGetStepDirection(arkode_mem, &h);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                      "Unable to access step direction");
      return retval;
    }

    if (h != SUNRcopysign(h, stepdir))
    {
      /* Reverse the sign of h. If adaptive, h will be overwritten anyway by the
       * initial step estimation since ARKodeReset must be called before this.
       * However, the sign of h will be used to check if the integration
       * direction and stop time are consistent, e.g., in ARKodeSetStopTime, so
       * we should not set h = 0. */
      ark_mem->h = -h;
      /* Clear previous initial step and force an initial step recomputation.
       * Normally, this would not occur after a reset, but it is necessary here
       * because the timestep used in one direction may not be suitable for the
       * other */
      ark_mem->h0u = ZERO;
      /* Reverse the step if in fixed mode. If adaptive, reset to 0 to clear any
       * old value from a call to ARKodeSetInit */
      ark_mem->hin = ark_mem->fixedstep ? -h : ZERO;

      /* Reset error controller (e.g., error and step size history) */
      if (ark_mem->hadapt_mem && ark_mem->hadapt_mem->hcontroller)
      {
        SUNErrCode err =
          SUNAdaptController_Reset(ark_mem->hadapt_mem->hcontroller);
        if (err != SUN_SUCCESS)
        {
          arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__,
                          __FILE__, "Unable to reset error controller object");
          return ARK_CONTROLLER_ERR;
        }
      }
    }
  }

  if (ark_mem->step_setstepdirection != NULL)
  {
    return ark_mem->step_setstepdirection(ark_mem, stepdir);
  }

  return ARK_SUCCESS;
}